

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O3

int __thiscall
gl4cts::SparseTextureAllocationTestCase::init
          (SparseTextureAllocationTestCase *this,EVP_PKEY_CTX *ctx)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  int *extraout_RAX;
  int *piVar2;
  iterator iVar3;
  int local_14;
  
  pvVar1 = &this->mSupportedTargets;
  iVar3._M_current =
       (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  piVar2 = (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0xde1;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8c1a;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8513;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x9009;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x806f;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
  }
  else {
    *iVar3._M_current = 0x84f5;
    (this->mSupportedTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  pvVar1 = &this->mFullArrayTargets;
  iVar3._M_current =
       (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  piVar2 = (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8c18;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8c1a;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8513;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
  }
  else {
    *iVar3._M_current = 0x9009;
    (this->mFullArrayTargets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  pvVar1 = &this->mSupportedInternalFormats;
  iVar3._M_current =
       (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8229;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8f94;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x822a;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8f98;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x822b;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8f95;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x822c;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8f99;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8d62;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8058;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8f97;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8059;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x906f;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x805b;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8f9b;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x822d;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x822f;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x881a;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x822e;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8230;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8814;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8c3a;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8c3d;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8231;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8232;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8233;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8234;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8235;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8236;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8237;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8238;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8239;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x823a;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x823b;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x823c;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8d8e;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8d7c;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8d88;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    iVar3._M_current =
         (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    piVar2 = (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = 0x8d76;
    iVar3._M_current = iVar3._M_current + 1;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == piVar2) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar3,&local_14);
    piVar2 = extraout_RAX;
  }
  else {
    *iVar3._M_current = 0x8d82;
    (this->mSupportedInternalFormats).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  return (int)piVar2;
}

Assistant:

void SparseTextureAllocationTestCase::init()
{
	mSupportedTargets.push_back(GL_TEXTURE_2D);
	mSupportedTargets.push_back(GL_TEXTURE_2D_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_CUBE_MAP);
	mSupportedTargets.push_back(GL_TEXTURE_CUBE_MAP_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_3D);
	mSupportedTargets.push_back(GL_TEXTURE_RECTANGLE);

	mFullArrayTargets.push_back(GL_TEXTURE_1D_ARRAY);
	mFullArrayTargets.push_back(GL_TEXTURE_2D_ARRAY);
	mFullArrayTargets.push_back(GL_TEXTURE_CUBE_MAP);
	mFullArrayTargets.push_back(GL_TEXTURE_CUBE_MAP_ARRAY);

	mSupportedInternalFormats.push_back(GL_R8);
	mSupportedInternalFormats.push_back(GL_R8_SNORM);
	mSupportedInternalFormats.push_back(GL_R16);
	mSupportedInternalFormats.push_back(GL_R16_SNORM);
	mSupportedInternalFormats.push_back(GL_RG8);
	mSupportedInternalFormats.push_back(GL_RG8_SNORM);
	mSupportedInternalFormats.push_back(GL_RG16);
	mSupportedInternalFormats.push_back(GL_RG16_SNORM);
	mSupportedInternalFormats.push_back(GL_RGB565);
	mSupportedInternalFormats.push_back(GL_RGBA8);
	mSupportedInternalFormats.push_back(GL_RGBA8_SNORM);
	mSupportedInternalFormats.push_back(GL_RGB10_A2);
	mSupportedInternalFormats.push_back(GL_RGB10_A2UI);
	mSupportedInternalFormats.push_back(GL_RGBA16);
	mSupportedInternalFormats.push_back(GL_RGBA16_SNORM);
	mSupportedInternalFormats.push_back(GL_R16F);
	mSupportedInternalFormats.push_back(GL_RG16F);
	mSupportedInternalFormats.push_back(GL_RGBA16F);
	mSupportedInternalFormats.push_back(GL_R32F);
	mSupportedInternalFormats.push_back(GL_RG32F);
	mSupportedInternalFormats.push_back(GL_RGBA32F);
	mSupportedInternalFormats.push_back(GL_R11F_G11F_B10F);
	mSupportedInternalFormats.push_back(GL_RGB9_E5);
	mSupportedInternalFormats.push_back(GL_R8I);
	mSupportedInternalFormats.push_back(GL_R8UI);
	mSupportedInternalFormats.push_back(GL_R16I);
	mSupportedInternalFormats.push_back(GL_R16UI);
	mSupportedInternalFormats.push_back(GL_R32I);
	mSupportedInternalFormats.push_back(GL_R32UI);
	mSupportedInternalFormats.push_back(GL_RG8I);
	mSupportedInternalFormats.push_back(GL_RG8UI);
	mSupportedInternalFormats.push_back(GL_RG16I);
	mSupportedInternalFormats.push_back(GL_RG16UI);
	mSupportedInternalFormats.push_back(GL_RG32I);
	mSupportedInternalFormats.push_back(GL_RG32UI);
	mSupportedInternalFormats.push_back(GL_RGBA8I);
	mSupportedInternalFormats.push_back(GL_RGBA8UI);
	mSupportedInternalFormats.push_back(GL_RGBA16I);
	mSupportedInternalFormats.push_back(GL_RGBA16UI);
	mSupportedInternalFormats.push_back(GL_RGBA32I);
}